

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::media_fragment::parse_moof(media_fragment *this)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  pointer puVar6;
  bool bVar7;
  pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  long local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (((this->moof_box_).size_ != 0) &&
     (puVar6 = (this->moof_box_).box_data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
     8 < (ulong)((long)(this->moof_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6))) {
    uVar9 = 8;
    puVar8 = puVar6;
    do {
      uVar5 = *(uint *)(puVar8 + uVar9);
      if (uVar5 == 0x1000000) {
        uVar10 = *(ulong *)(puVar6 + uVar9 + 8);
        uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                 (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                 (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                 (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
        local_f0 = 8;
      }
      else {
        uVar10 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18);
        local_f0 = 0;
      }
      uVar1 = puVar6[uVar9 + 4];
      uVar2 = puVar6[uVar9 + 5];
      uVar3 = puVar6[uVar9 + 6];
      uVar4 = puVar6[uVar9 + 7];
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"mfhd","");
      if ((((uVar1 != (uchar)*local_50[0]) || (uVar2 != *(uchar *)((long)local_50[0] + 1))) ||
          (uVar3 != *(uchar *)((long)local_50[0] + 2))) ||
         (bVar7 = true, uVar4 != *(uchar *)((long)local_50[0] + 3))) {
        bVar7 = false;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (bVar7) {
        uVar5 = *(uint *)(puVar6 + local_f0 + uVar9 + 0xc);
        *(uint *)&(this->mfhd_).super_full_box.field_0x6c =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
      else {
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"trun","");
        if (((uVar1 != (uchar)*local_70[0]) || (uVar2 != *(uchar *)((long)local_70[0] + 1))) ||
           ((uVar3 != *(uchar *)((long)local_70[0] + 2) ||
            (bVar7 = true, uVar4 != *(uchar *)((long)local_70[0] + 3))))) {
          bVar7 = false;
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (bVar7) {
          trun::parse(&this->trun_,(char *)(puVar6 + local_f0 + uVar9));
        }
        else {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"tfdt","");
          if (((uVar1 != (uchar)*local_90[0]) || (uVar2 != *(uchar *)((long)local_90[0] + 1))) ||
             ((uVar3 != *(uchar *)((long)local_90[0] + 2) ||
              (bVar7 = true, uVar4 != *(uchar *)((long)local_90[0] + 3))))) {
            bVar7 = false;
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          if (bVar7) {
            tfdt::parse(&this->tfdt_,(char *)(puVar6 + local_f0 + uVar9));
          }
          else {
            local_b0[0] = local_a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"tfhd","");
            if ((((uVar1 != (uchar)*local_b0[0]) || (uVar2 != *(uchar *)((long)local_b0[0] + 1))) ||
                (uVar3 != *(uchar *)((long)local_b0[0] + 2))) ||
               (bVar7 = true, uVar4 != *(uchar *)((long)local_b0[0] + 3))) {
              bVar7 = false;
            }
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0],local_a0[0] + 1);
            }
            if (bVar7) {
              tfhd::parse(&this->tfhd_,(char *)(puVar6 + local_f0 + uVar9));
            }
            else {
              local_d0[0] = local_c0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"traf","");
              if (((uVar1 != (uchar)*local_d0[0]) || (uVar2 != *(uchar *)((long)local_d0[0] + 1)))
                 || ((uVar3 != *(uchar *)((long)local_d0[0] + 2) ||
                     (bVar7 = true, uVar4 != *(uchar *)((long)local_d0[0] + 3))))) {
                bVar7 = false;
              }
              if (local_d0[0] != local_c0) {
                operator_delete(local_d0[0],local_c0[0] + 1);
              }
              uVar10 = uVar10 & 0xffffffff;
              if (bVar7) {
                uVar10 = 8;
              }
            }
          }
        }
      }
      uVar9 = uVar9 + uVar10;
      puVar8 = (this->moof_box_).box_data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->moof_box_).box_data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8));
  }
  return;
}

Assistant:

void media_fragment::parse_moof()
	{
		if (!moof_box_.size_)
			return;

		uint64_t box_size = 0;
		uint64_t offset = 8;
		uint8_t * ptr = &moof_box_.box_data_[0];

		while (moof_box_.box_data_.size() > offset)
		{
			unsigned int temp_off = 0;
			box_size = (uint64_t)fmp4_read_uint32((char *)&moof_box_.box_data_[offset]);

			char name[5] = { (char)ptr[offset + 4],(char)ptr[offset + 5],(char)ptr[offset + 6],(char)ptr[offset + 7],'\0' };

			if (box_size == 1) // the box_size is a large size (should not happen in fmp4)
			{
				temp_off = 8;
				box_size = fmp4_read_uint64((char *)& ptr[offset + temp_off]);
			}

			if (f_compare_4cc(name,"mfhd"))
			{
				mfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				//cout << "mfhd size" << box_size << endl;
				continue;
			}

			if (f_compare_4cc(name,"trun"))
			{
				trun_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name,"tfdt"))
			{
				tfdt_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name,"tfhd"))
			{
				tfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			// cmaf style only one traf box per moof so we skip it
			if (f_compare_4cc(name, "traf"))
			{
				offset += 8;
			}
			else
				offset += (unsigned int)box_size;
		}
	}